

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O3

uint32 BailOutRecord::BailOutFromLoopBodyHelper
                 (JavascriptCallStackLayout *layout,BailOutRecord *bailOutRecord,
                 uint32 bailOutOffset,BailOutKind bailOutKind,Var branchValue,Var *registerSaves,
                 BailOutReturnValue *bailOutReturnValue)

{
  uint uVar1;
  JavascriptFunction *this;
  ThreadContext *pTVar2;
  InterpreterStackFrame *newInstance;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  undefined4 *puVar7;
  FunctionBody *this_00;
  ScriptContext *scriptContext;
  undefined4 extraout_var;
  char16 *pcVar8;
  char16 *pcVar9;
  char *pcVar10;
  undefined4 extraout_var_00;
  Var *pArgumentsObject;
  FunctionInfo *pFVar11;
  void *in_stack_ffffffffffffff28;
  wchar local_c8 [4];
  char16 debugStringBuffer [42];
  
  if (bailOutRecord->parent != (BailOutRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x547,"(bailOutRecord->parent == nullptr)",
                       "bailOutRecord->parent == nullptr");
    if (!bVar4) goto LAB_003fd835;
    *puVar7 = 0;
  }
  this = *(JavascriptFunction **)layout;
  unique0x10000776 = branchValue;
  this_00 = Js::JavascriptFunction::GetFunctionBody(this);
  Js::FunctionBody::SetRecentlyBailedOutOfJittedLoopBody(this_00,true);
  scriptContext = Js::FunctionProxy::GetScriptContext((FunctionProxy *)this_00);
  pTVar2 = scriptContext->threadContext;
  pTVar2->disableImplicitFlags = DisableImplicitNoFlag;
  newInstance = pTVar2->leafInterpreterFrame;
  uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this_00);
  pFVar11 = (this_00->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar11 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_003fd835;
    *puVar7 = 0;
    pFVar11 = (this_00->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar5,pFVar11->functionId);
  if ((bVar4) && ((bailOutKind != BailOnSimpleJitToFullJitLoopBody || (DAT_015bc46a == '\x01')))) {
    if (DAT_015bf388 != DAT_015bf390) {
      bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_015bf368,bailOutKind);
      if (!bVar4) goto LAB_003fd568;
    }
    iVar6 = (*(this_00->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this_00);
    pcVar8 = Js::FunctionProxy::GetDebugNumberSet((FunctionProxy *)this_00,(wchar (*) [42])local_c8)
    ;
    uVar1 = *(uint *)(newInstance + 0xcc);
    pcVar9 = Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode);
    Output::Print(L"BailOut: function: %s (%s) Loop: %d offset: #%04x Opcode: %s",
                  CONCAT44(extraout_var,iVar6),pcVar8,(ulong)uVar1,(ulong)bailOutOffset,pcVar9);
    if (bailOutKind != BailOutInvalid) {
      pcVar10 = GetBailOutKindName(bailOutKind);
      Output::Print(L" Kind: %S",pcVar10);
    }
    Output::Print(L"\n");
  }
LAB_003fd568:
  uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this_00);
  pFVar11 = (this_00->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar11 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_003fd835;
    *puVar7 = 0;
    pFVar11 = (this_00->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,BailOutPhase,uVar5,pFVar11->functionId);
  if ((bVar4) && ((bailOutKind != BailOnSimpleJitToFullJitLoopBody || (DAT_015bc46a == '\x01')))) {
    if (DAT_015bf388 != DAT_015bf390) {
      bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_015bf368,bailOutKind);
      if (!bVar4) goto LAB_003fd6b8;
    }
    iVar6 = (*(this_00->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this_00);
    uVar1 = *(uint *)(newInstance + 0xcc);
    pcVar8 = Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode);
    Output::Print(L"BailOut: function %s, Loop: %d Opcode: %s",CONCAT44(extraout_var_00,iVar6),
                  (ulong)uVar1,pcVar8);
    if (bailOutKind != BailOutInvalid) {
      pcVar10 = GetBailOutKindName(bailOutKind);
      Output::Print(L" Kind: %S",pcVar10);
    }
    Output::Print(L"\n");
  }
LAB_003fd6b8:
  pArgumentsObject = Js::JavascriptCallStackLayout::GetArgumentsObjectLocation(layout);
  RestoreValues(bailOutRecord,bailOutKind,layout,newInstance,scriptContext,true,registerSaves,
                bailOutReturnValue,pArgumentsObject,stack0xffffffffffffff90,(void *)0x0,true,
                in_stack_ffffffffffffff28);
  uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this_00);
  pFVar11 = (this_00->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar11 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_003fd835;
    *puVar7 = 0;
    pFVar11 = (this_00->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,BailOutPhase,uVar5,pFVar11->functionId);
  if (!bVar4) {
    uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this_00);
    pFVar11 = (this_00->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar11 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar4) {
LAB_003fd835:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
      pFVar11 = (this_00->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar5,pFVar11->functionId);
    if (!bVar4) goto LAB_003fd813;
  }
  Output::Flush();
LAB_003fd813:
  UpdatePolymorphicFieldAccess(this,bailOutRecord);
  return bailOutOffset;
}

Assistant:

uint32
BailOutRecord::BailOutFromLoopBodyHelper(Js::JavascriptCallStackLayout * layout, BailOutRecord const * bailOutRecord,
    uint32 bailOutOffset, IR::BailOutKind bailOutKind, Js::Var branchValue, Js::Var *registerSaves, BailOutReturnValue * bailOutReturnValue)
{
    Assert(bailOutRecord->parent == nullptr);

    Js::JavascriptFunction * function = layout->functionObject;

    Js::FunctionBody * executeFunction = function->GetFunctionBody();
    executeFunction->SetRecentlyBailedOutOfJittedLoopBody(true);

    Js::ScriptContext * functionScriptContext = executeFunction->GetScriptContext();

    // Clear the disable implicit call bit in case we bail from that region
    functionScriptContext->GetThreadContext()->ClearDisableImplicitFlags();

    // The current interpreter frame for the loop body
    Js::InterpreterStackFrame * interpreterFrame = functionScriptContext->GetThreadContext()->GetLeafInterpreterFrame();
#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
    BAILOUT_KIND_TRACE(executeFunction, bailOutKind, _u("BailOut: function: %s (%s) Loop: %d offset: #%04x Opcode: %s"),
        executeFunction->GetDisplayName(), executeFunction->GetDebugNumberSet(debugStringBuffer), interpreterFrame->GetCurrentLoopNum(),
        bailOutOffset, Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode));

    BAILOUT_TESTTRACE(executeFunction, bailOutKind, _u("BailOut: function %s, Loop: %d Opcode: %s"), executeFunction->GetDisplayName(),
        interpreterFrame->GetCurrentLoopNum(), Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode));

    // Restore bailout values
    bailOutRecord->RestoreValues(bailOutKind, layout, interpreterFrame, functionScriptContext, true, registerSaves, bailOutReturnValue, layout->GetArgumentsObjectLocation(), branchValue);

    BAILOUT_FLUSH(executeFunction);

    UpdatePolymorphicFieldAccess(function, bailOutRecord);

    // Return the resume byte code offset from the loop body to restart interpreter execution.
    return bailOutOffset;
}